

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall flatbuffers::Parser::TokenError(Parser *this)

{
  Parser *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  TokenToStringId_abi_cxx11_(&local_38,in_RSI,(in_RSI->super_ParserState).token_);
  std::operator+(&bStack_58,"cannot parse value starting with: ",&local_38);
  Error(this,(string *)in_RSI);
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::TokenError() {
  return Error("cannot parse value starting with: " + TokenToStringId(token_));
}